

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::DefParamSymbol::resolve(DefParamSymbol *this)

{
  LookupLocation lookupLocation;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  string_view arg;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  bool bVar1;
  ParameterSymbol *this_00;
  SourceLocation SVar2;
  EqualsValueClauseSyntax *rhs;
  ASTContext *exprContext;
  not_null<const_slang::ast::DeclaredType_*> this_01;
  DeclaredType *this_02;
  Expression *pEVar3;
  Symbol *in_RDI;
  LookupLocation LVar4;
  type *type;
  type *expr;
  ASTContext typeContext;
  DataTypeSyntax *typeSyntax;
  not_null<const_slang::ast::DeclaredType_*> declType;
  SourceRange equalsRange;
  ExpressionSyntax *exprSyntax;
  Diagnostic *diag_1;
  Symbol *invalidParent;
  ParameterSymbol *param;
  anon_class_16_2_3fde98ca makeInvalid;
  Diagnostic *diag;
  LookupResult result;
  ASTContext context;
  DefParamAssignmentSyntax *assignment;
  Compilation *comp;
  Scope *scope;
  SyntaxNode *syntax;
  ValueSymbol *in_stack_fffffffffffffa28;
  LookupResult *in_stack_fffffffffffffa30;
  SourceLocation in_stack_fffffffffffffa38;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffa40;
  Scope *in_stack_fffffffffffffa48;
  SourceLocation in_stack_fffffffffffffa50;
  SourceLocation in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  DiagCode code;
  Diagnostic *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  SyntaxNode *in_stack_fffffffffffffa80;
  ASTContext *in_stack_fffffffffffffad0;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffad8;
  SourceLocation in_stack_fffffffffffffae0;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffae8;
  SourceLocation in_stack_fffffffffffffaf8;
  ASTContext *in_stack_fffffffffffffb00;
  bitmask<slang::ast::EvalFlags> local_499 [41];
  bitmask<slang::ast::ASTFlags> local_470;
  SourceRange local_468;
  __tuple_element_t<1UL,_tuple<const_Expression_*,_const_Type_*>_> *local_450;
  __tuple_element_t<0UL,_tuple<const_Expression_*,_const_Type_*>_> *local_448;
  bitmask<slang::ast::ASTFlags> local_440;
  SourceRange local_438;
  bitmask<slang::ast::ASTFlags> local_418;
  Scope *local_410;
  uint32_t local_408;
  Scope *local_400;
  uint32_t local_3f8;
  DataTypeSyntax *local_3b8;
  DeclaredType *local_3b0;
  SourceRange local_3a8;
  ASTContext *local_398;
  undefined8 local_390;
  undefined4 local_384;
  SourceRange local_380;
  undefined4 local_36c;
  Diagnostic *local_368;
  SourceLocation local_360;
  Scope *in_stack_fffffffffffffca8;
  Symbol *in_stack_fffffffffffffcb0;
  bitmask<slang::ast::LookupFlags> local_2d8 [4];
  size_t local_2c8;
  Expression *in_stack_fffffffffffffdc8;
  ASTContext *in_stack_fffffffffffffdd0;
  bitmask<slang::ast::EvalFlags> in_stack_fffffffffffffddf;
  LookupResult *in_stack_fffffffffffffe00;
  ASTContext *in_stack_fffffffffffffe08;
  NameSyntax *in_stack_fffffffffffffe10;
  bitmask<slang::ast::LookupFlags> in_stack_fffffffffffffe1c;
  bitmask<slang::ast::ASTFlags> local_88;
  Scope *local_80;
  uint32_t local_78;
  Scope *local_70;
  uint32_t local_68;
  DefParamAssignmentSyntax *local_28;
  Compilation *local_20;
  Scope *local_18;
  SyntaxNode *local_10;
  
  code = SUB84((ulong)in_stack_fffffffffffffa60 >> 0x20,0);
  local_10 = Symbol::getSyntax(in_RDI);
  local_18 = Symbol::getParentScope(in_RDI);
  local_20 = Scope::getCompilation(local_18);
  local_28 = slang::syntax::SyntaxNode::as<slang::syntax::DefParamAssignmentSyntax>(local_10);
  LVar4 = LookupLocation::before((Symbol *)in_stack_fffffffffffffa30);
  local_80 = LVar4.scope;
  local_78 = LVar4.index;
  local_70 = local_80;
  local_68 = local_78;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_88,None);
  LVar4._8_8_ = in_stack_fffffffffffffa50;
  LVar4.scope = in_stack_fffffffffffffa48;
  ASTContext::ASTContext
            ((ASTContext *)in_stack_fffffffffffffa38,(Scope *)in_stack_fffffffffffffa30,LVar4,
             in_stack_fffffffffffffa40);
  LookupResult::LookupResult(in_stack_fffffffffffffa30);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x7612d2);
  bitmask<slang::ast::LookupFlags>::bitmask(local_2d8,NoSelectors);
  Lookup::name(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe1c,
               in_stack_fffffffffffffe00);
  LookupResult::reportDiags(in_stack_fffffffffffffa30,(ASTContext *)in_stack_fffffffffffffa28);
  in_RDI[1].name._M_len = local_2c8;
  if ((in_RDI[1].name._M_len != 0) && (*(int *)in_RDI[1].name._M_len != 0x27)) {
    not_null<slang::syntax::NameSyntax_*>::operator->
              ((not_null<slang::syntax::NameSyntax_*> *)0x76137b);
    slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffa80);
    sourceRange.endLoc = in_stack_fffffffffffffa58;
    sourceRange.startLoc = in_stack_fffffffffffffa50;
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa48,code,sourceRange);
    Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffa30,
                        SUB84(in_stack_fffffffffffffa40.m_bits >> 0x20,0),in_stack_fffffffffffffa38)
    ;
    in_RDI[1].name._M_len = 0;
  }
  if (in_RDI[1].name._M_len == 0) {
    resolve::anon_class_16_2_3fde98ca::operator()
              ((anon_class_16_2_3fde98ca *)in_stack_fffffffffffffa40.m_bits);
  }
  else {
    this_00 = Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0x7614d2);
    bVar1 = ParameterSymbolBase::isLocalParam(&this_00->super_ParameterSymbolBase);
    if (bVar1) {
      not_null<slang::syntax::NameSyntax_*>::operator->
                ((not_null<slang::syntax::NameSyntax_*> *)0x761535);
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffa80);
      sourceRange_00.endLoc = in_stack_fffffffffffffa58;
      sourceRange_00.startLoc = in_stack_fffffffffffffa50;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa48,code,sourceRange_00);
      arg._M_len._4_4_ = in_stack_fffffffffffffa7c;
      arg._M_len._0_4_ = in_stack_fffffffffffffa78;
      arg._M_str = (char *)in_stack_fffffffffffffa80;
      Diagnostic::operator<<(in_stack_fffffffffffffa70,arg);
      resolve::anon_class_16_2_3fde98ca::operator()
                ((anon_class_16_2_3fde98ca *)in_stack_fffffffffffffa40.m_bits);
    }
    else {
      SVar2 = (SourceLocation)
              checkDefparamHierarchy(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      local_360 = SVar2;
      if (SVar2 == (SourceLocation)0x0) {
        rhs = not_null<slang::syntax::EqualsValueClauseSyntax_*>::operator->
                        ((not_null<slang::syntax::EqualsValueClauseSyntax_*> *)0x761750);
        exprContext = (ASTContext *)
                      not_null<slang::syntax::ExpressionSyntax_*>::operator*
                                ((not_null<slang::syntax::ExpressionSyntax_*> *)0x76176b);
        local_398 = exprContext;
        not_null<slang::syntax::EqualsValueClauseSyntax_*>::operator->
                  ((not_null<slang::syntax::EqualsValueClauseSyntax_*> *)0x761796);
        local_3a8 = parsing::Token::range((Token *)in_stack_fffffffffffffa50);
        this_01 = ValueSymbol::getDeclaredType(in_stack_fffffffffffffa28);
        local_3b0 = this_01.ptr;
        this_02 = not_null<const_slang::ast::DeclaredType_*>::operator->
                            ((not_null<const_slang::ast::DeclaredType_*> *)0x761811);
        local_3b8 = DeclaredType::getTypeSyntax(this_02);
        if ((local_3b8 == (DataTypeSyntax *)0x0) ||
           ((local_3b8->super_ExpressionSyntax).super_SyntaxNode.kind != ImplicitType)) {
          not_null<const_slang::ast::DeclaredType_*>::operator->
                    ((not_null<const_slang::ast::DeclaredType_*> *)0x7619d3);
          DeclaredType::getType(this_01.ptr);
          local_468 = local_3a8;
          bitmask<slang::ast::ASTFlags>::bitmask(&local_470,None);
          assignmentRange_00.endLoc = in_stack_fffffffffffffaf8;
          assignmentRange_00.startLoc = SVar2;
          pEVar3 = Expression::bindRValue
                             ((Type *)in_stack_fffffffffffffae0,
                              (ExpressionSyntax *)in_stack_fffffffffffffad8.m_bits,
                              assignmentRange_00,in_stack_fffffffffffffad0,in_stack_fffffffffffffae8
                             );
          *(Expression **)(in_RDI + 1) = pEVar3;
        }
        else {
          Symbol::getParentScope((Symbol *)this_00);
          LVar4 = LookupLocation::before((Symbol *)in_stack_fffffffffffffa30);
          local_410 = LVar4.scope;
          local_408 = LVar4.index;
          local_400 = local_410;
          local_3f8 = local_408;
          bitmask<slang::ast::ASTFlags>::bitmask(&local_418,None);
          lookupLocation._8_8_ = in_stack_fffffffffffffa50;
          lookupLocation.scope = in_stack_fffffffffffffa48;
          ASTContext::ASTContext
                    ((ASTContext *)in_stack_fffffffffffffa38,(Scope *)in_stack_fffffffffffffa30,
                     lookupLocation,in_stack_fffffffffffffa40);
          local_438 = local_3a8;
          bitmask<slang::ast::ASTFlags>::bitmask(&local_440,None);
          assignmentRange.endLoc = (SourceLocation)in_stack_fffffffffffffae8.m_bits;
          assignmentRange.startLoc = in_stack_fffffffffffffae0;
          Expression::bindImplicitParam
                    ((DataTypeSyntax *)in_stack_fffffffffffffad0,(ExpressionSyntax *)rhs,
                     assignmentRange,exprContext,in_stack_fffffffffffffb00,in_stack_fffffffffffffad8
                    );
          local_448 = std::get<0ul,slang::ast::Expression_const*,slang::ast::Type_const*>
                                ((tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*> *)
                                 0x76198a);
          local_450 = std::get<1ul,slang::ast::Expression_const*,slang::ast::Type_const*>
                                ((tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*> *)
                                 0x76199f);
          *(__tuple_element_t<0UL,_tuple<const_Expression_*,_const_Type_*>_> *)(in_RDI + 1) =
               *local_448;
          in_stack_fffffffffffffa30 = (LookupResult *)local_440.m_bits;
        }
        local_499[0].m_bits = '\0';
        bitmask<slang::ast::EvalFlags>::bitmask(local_499);
        ASTContext::eval(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                         in_stack_fffffffffffffddf);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x761ab7);
        if (*(long *)(*(long *)(in_RDI + 1) + 0x10) == 0) {
          *(undefined1 **)(*(long *)(in_RDI + 1) + 0x10) = slang::ConstantValue::Invalid;
        }
      }
      else {
        local_36c = 0x2b0006;
        not_null<slang::syntax::NameSyntax_*>::operator->
                  ((not_null<slang::syntax::NameSyntax_*> *)0x76165c);
        local_380 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffa80);
        sourceRange_01.endLoc = in_stack_fffffffffffffa58;
        sourceRange_01.startLoc = in_stack_fffffffffffffa50;
        local_368 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa48,code,sourceRange_01)
        ;
        local_384 = 0xe50006;
        local_390 = *(undefined8 *)((long)local_360 + 0x18);
        Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffa30,
                            SUB84(in_stack_fffffffffffffa40.m_bits >> 0x20,0),
                            in_stack_fffffffffffffa38);
        resolve::anon_class_16_2_3fde98ca::operator()
                  ((anon_class_16_2_3fde98ca *)in_stack_fffffffffffffa40.m_bits);
      }
    }
  }
  LookupResult::~LookupResult(in_stack_fffffffffffffa30);
  return;
}

Assistant:

void DefParamSymbol::resolve() const {
    auto syntax = getSyntax();
    auto scope = getParentScope();
    SLANG_ASSERT(syntax && scope);

    auto& comp = scope->getCompilation();
    auto& assignment = syntax->as<DefParamAssignmentSyntax>();

    ASTContext context(*scope, LookupLocation::before(*this));
    LookupResult result;
    Lookup::name(*assignment.name, context, LookupFlags::NoSelectors, result);
    result.reportDiags(context);

    target = result.found;
    if (target && target->kind != SymbolKind::Parameter) {
        auto& diag = context.addDiag(diag::DefParamTarget, assignment.name->sourceRange());
        diag.addNote(diag::NoteDeclarationHere, target->location);
        target = nullptr;
    }

    auto makeInvalid = [&] {
        initializer = comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
        initializer->constant = &ConstantValue::Invalid;
    };

    if (!target) {
        makeInvalid();
        return;
    }

    auto& param = target->as<ParameterSymbol>();
    if (param.isLocalParam()) {
        context.addDiag(diag::DefParamLocal, assignment.name->sourceRange()) << param.name;
        makeInvalid();
        return;
    }

    if (auto invalidParent = checkDefparamHierarchy(*target, *scope)) {
        auto& diag = context.addDiag(diag::DefparamBadHierarchy, assignment.name->sourceRange());
        diag.addNote(diag::NoteCommonAncestor, invalidParent->location);

        makeInvalid();
        return;
    }

    // We need to know the parameter's type (or lack thereof) in order to
    // correctly bind a value for it.
    auto& exprSyntax = *assignment.setter->expr;
    auto equalsRange = assignment.setter->equals.range();
    auto declType = param.getDeclaredType();
    auto typeSyntax = declType->getTypeSyntax();

    if (typeSyntax && typeSyntax->kind == SyntaxKind::ImplicitType) {
        ASTContext typeContext(*param.getParentScope(), LookupLocation::before(param));
        auto [expr, type] = Expression::bindImplicitParam(*typeSyntax, exprSyntax, equalsRange,
                                                          context, typeContext);
        initializer = expr;
    }
    else {
        initializer = &Expression::bindRValue(declType->getType(), exprSyntax, equalsRange,
                                              context);
    }

    context.eval(*initializer);
    if (!initializer->constant)
        initializer->constant = &ConstantValue::Invalid;
}